

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Block * __thiscall
soul::heart::Parser::getBlock(Parser *this,FunctionParseState *state,Identifier name)

{
  pointer pBVar1;
  string *psVar2;
  pointer pBVar3;
  Block *pBVar4;
  Identifier *in_R9;
  bool bVar5;
  string *local_58;
  CompileMessage local_50;
  
  pBVar3 = (state->blocks).
           super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (state->blocks).
           super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pBVar3 == pBVar1;
  if (!bVar5) {
    pBVar4 = pBVar3->block;
    psVar2 = (pBVar4->name).name;
    while (psVar2 != name.name) {
      pBVar3 = pBVar3 + 1;
      bVar5 = pBVar3 == pBVar1;
      if (bVar5) goto LAB_00238785;
      pBVar4 = pBVar3->block;
      psVar2 = (pBVar4->name).name;
    }
    if (!bVar5) goto LAB_00238787;
  }
LAB_00238785:
  pBVar4 = (Block *)0x0;
LAB_00238787:
  if (pBVar4 != (Block *)0x0) {
    return pBVar4;
  }
  local_58 = name.name;
  CompileMessageHelpers::createMessage<soul::Identifier&>
            (&local_50,(CompileMessageHelpers *)0x1,none,0x288cbb,(char *)&local_58,in_R9);
  (*(this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser[2])(this,&local_50);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
    operator_delete(local_50.description._M_dataplus._M_p,
                    local_50.description.field_2._M_allocated_capacity + 1);
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::Block& getBlock (const FunctionParseState& state, Identifier name)
    {
        auto b = findBlock (state, name);

        if (b == nullptr)
            throwError (Errors::cannotFind (name));

        return *b;
    }